

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O2

void __thiscall SudokuGitter::SudokuGitter(SudokuGitter *this,uint elements)

{
  ostream *poVar1;
  ulong __n;
  allocator_type local_32;
  allocator_type local_31;
  _Vector_base<cell,_std::allocator<cell>_> local_30;
  
  __n = (ulong)elements;
  std::vector<cell,_std::allocator<cell>_>::vector
            ((vector<cell,_std::allocator<cell>_> *)&local_30,__n,&local_31);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&this->cells,__n,(value_type *)&local_30,&local_32);
  std::_Vector_base<cell,_std::allocator<cell>_>::~_Vector_base(&local_30);
  this->elements = elements;
  this->quadWidth = (uint)((ulong)elements / ((long)SQRT((double)__n) & 0xffffffffU));
  this->quadHeight = (uint)(long)SQRT((double)__n);
  poVar1 = std::operator<<((ostream *)&std::cout,"Create sudoku with: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," elements.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"quad height: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," quad width:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

SudokuGitter::SudokuGitter(const unsigned int elements) : elements(elements),
                                                          cells(elements, vector<cell>(elements)),
                                                          quadHeight(static_cast<const unsigned int>(std::sqrt(
                                                                  elements))),
                                                          quadWidth(
                                                                  elements / static_cast<const unsigned int>(std::sqrt(
                                                                          elements))) {
    cout << "Create sudoku with: " << elements << " elements." << endl;
    cout << "quad height: " << getQuadHeight() << " quad width:" << getQuadWidth() << endl;
}